

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O2

void __thiscall FCommandBuffer::Draw(FCommandBuffer *this,int x,int y,int scale,bool cursor)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  FFont *pFVar5;
  DFrameBuffer *pDVar6;
  
  if (scale == 1) {
    DCanvas::DrawChar((DCanvas *)screen,ConFont,8,x,y,'\x1c',0);
    pDVar6 = screen;
    pFVar5 = ConFont;
    iVar3 = (*ConFont->_vptr_FFont[3])(ConFont,0x1c);
    DCanvas::DrawText((DCanvas *)pDVar6,pFVar5,8,iVar3 + x,y,(this->Text).Chars + this->StartPos,0);
    pDVar6 = screen;
    pFVar5 = ConFont;
    if (!cursor) {
      return;
    }
    iVar3 = (*ConFont->_vptr_FFont[3])(ConFont,0x1c);
    uVar1 = this->CursorPos;
    uVar2 = this->StartPos;
    iVar4 = (*ConFont->_vptr_FFont[3])(ConFont,0xb);
    iVar3 = (uVar1 - uVar2) * iVar4 + x + iVar3;
    iVar4 = 0;
  }
  else {
    DCanvas::DrawChar((DCanvas *)screen,ConFont,8,x,y,'\x1c',0x40001399,
                      (screen->super_DSimpleCanvas).super_DCanvas.Width / scale,0x4000139a,
                      (screen->super_DSimpleCanvas).super_DCanvas.Height / scale,0x400013a8,1,0);
    pDVar6 = screen;
    pFVar5 = ConFont;
    iVar3 = (*ConFont->_vptr_FFont[3])(ConFont,0x1c);
    DCanvas::DrawText((DCanvas *)pDVar6,pFVar5,8,iVar3 + x,y,(this->Text).Chars + this->StartPos,
                      0x40001399,(screen->super_DSimpleCanvas).super_DCanvas.Width / scale,
                      0x4000139a,(screen->super_DSimpleCanvas).super_DCanvas.Height / scale,
                      0x400013a8,1,0);
    pDVar6 = screen;
    pFVar5 = ConFont;
    if (!cursor) {
      return;
    }
    iVar3 = (*ConFont->_vptr_FFont[3])(ConFont,0x1c);
    uVar1 = this->CursorPos;
    uVar2 = this->StartPos;
    iVar4 = (*ConFont->_vptr_FFont[3])(ConFont,0xb);
    iVar3 = (uVar1 - uVar2) * iVar4 + x + iVar3;
    iVar4 = 0x40001399;
  }
  DCanvas::DrawChar((DCanvas *)pDVar6,pFVar5,10,iVar3,y,'\v',iVar4);
  return;
}

Assistant:

void Draw(int x, int y, int scale, bool cursor)
	{
		if (scale == 1)
		{
			screen->DrawChar(ConFont, CR_ORANGE, x, y, '\x1c', TAG_DONE);
			screen->DrawText(ConFont, CR_ORANGE, x + ConFont->GetCharWidth(0x1c), y,
				&Text[StartPos], TAG_DONE);

			if (cursor)
			{
				screen->DrawChar(ConFont, CR_YELLOW,
					x + ConFont->GetCharWidth(0x1c) + (CursorPos - StartPos) * ConFont->GetCharWidth(0xb),
					y, '\xb', TAG_DONE);
			}
		}
		else
		{
			screen->DrawChar(ConFont, CR_ORANGE, x, y, '\x1c',
				DTA_VirtualWidth, screen->GetWidth() / scale,
				DTA_VirtualHeight, screen->GetHeight() / scale,
				DTA_KeepRatio, true, TAG_DONE);

			screen->DrawText(ConFont, CR_ORANGE, x + ConFont->GetCharWidth(0x1c), y,
				&Text[StartPos],
				DTA_VirtualWidth, screen->GetWidth() / scale,
				DTA_VirtualHeight, screen->GetHeight() / scale,
				DTA_KeepRatio, true, TAG_DONE);

			if (cursor)
			{
				screen->DrawChar(ConFont, CR_YELLOW,
					x + ConFont->GetCharWidth(0x1c) + (CursorPos - StartPos) * ConFont->GetCharWidth(0xb),
					y, '\xb',
					DTA_VirtualWidth, screen->GetWidth() / scale,
					DTA_VirtualHeight, screen->GetHeight() / scale,
					DTA_KeepRatio, true, TAG_DONE);
			}
		}
	}